

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O0

size_t apduCmdEnc(octet *apdu,apdu_cmd_t *cmd)

{
  size_t sVar1;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  size_t count;
  long lVar2;
  undefined1 *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != (undefined1 *)0x0) {
    *in_RDI = *in_RSI;
    in_RDI[1] = in_RSI[1];
    in_RDI[2] = in_RSI[2];
    in_RDI[3] = in_RSI[3];
    local_8 = in_RDI + 4;
  }
  lVar2 = 4;
  if (*(long *)(in_RSI + 0x10) == 0) {
    sVar1 = *(long *)(in_RSI + 0x10) + 4;
  }
  else if ((*(ulong *)(in_RSI + 0x10) < 0x100) && (*(ulong *)(in_RSI + 8) < 0x101)) {
    if (local_8 != (undefined1 *)0x0) {
      *local_8 = (char)*(undefined8 *)(in_RSI + 0x10);
      memCopy(in_RSI,(void *)0x4,0x110588);
      local_8 = local_8 + *(long *)(in_RSI + 0x10) + 1;
    }
    sVar1 = *(long *)(in_RSI + 0x10) + 1 + lVar2;
  }
  else {
    if (local_8 != (undefined1 *)0x0) {
      *local_8 = 0;
      local_8[1] = (char)((ulong)*(undefined8 *)(in_RSI + 0x10) >> 8);
      local_8[2] = (char)*(undefined8 *)(in_RSI + 0x10);
      memCopy(in_RSI,(void *)0x4,0x110613);
      local_8 = local_8 + *(long *)(in_RSI + 0x10) + 3;
    }
    sVar1 = *(long *)(in_RSI + 0x10) + 3 + lVar2;
  }
  if (*(long *)(in_RSI + 8) != 0) {
    if ((*(ulong *)(in_RSI + 8) < 0x101) && (*(ulong *)(in_RSI + 0x10) < 0x100)) {
      if (local_8 != (undefined1 *)0x0) {
        *local_8 = (char)*(undefined8 *)(in_RSI + 8);
      }
      sVar1 = sVar1 + 1;
    }
    else if (*(long *)(in_RSI + 0x10) == 0) {
      if (local_8 != (undefined1 *)0x0) {
        *local_8 = 0;
        local_8[1] = (char)((ulong)*(undefined8 *)(in_RSI + 8) >> 8);
        local_8[2] = (char)*(undefined8 *)(in_RSI + 8);
      }
      sVar1 = sVar1 + 3;
    }
    else {
      if (local_8 != (undefined1 *)0x0) {
        *local_8 = (char)((ulong)*(undefined8 *)(in_RSI + 8) >> 8);
        local_8[1] = (char)*(undefined8 *)(in_RSI + 8);
      }
      sVar1 = sVar1 + 2;
    }
  }
  return sVar1;
}

Assistant:

size_t apduCmdEnc(octet apdu[], const apdu_cmd_t* cmd)
{
	size_t count;
	// pre
	ASSERT(apduCmdIsValid(cmd));
	// кодировать заголовок
	if (apdu)
	{
		ASSERT(memIsDisjoint2(apdu, 4, cmd, apduCmdSizeof(cmd)));
		apdu[0] = cmd->cla, apdu[1] = cmd->ins;
		apdu[2] = cmd->p1, apdu[3] = cmd->p2;
		apdu += 4;
	}
	count = 4;
	// кодировать [cdf_len]cdf: пустая форма
	if (cmd->cdf_len == 0)
		count += 0 + cmd->cdf_len;
	// кодировать [cdf_len]cdf: короткая форма
	else if (cmd->cdf_len < 256 && cmd->rdf_len <= 256)
	{
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 1, cmd, apduCmdSizeof(cmd)));
			apdu[0] = (octet)cmd->cdf_len;
			memCopy(apdu + 1, cmd->cdf, cmd->cdf_len);
			apdu += 1 + cmd->cdf_len;
		}
		count += 1 + cmd->cdf_len;
	}
	// кодировать [cdf_len]cdf: длинная форма
	else
	{
		ASSERT(cmd->cdf_len < 65536);
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 3, cmd, apduCmdSizeof(cmd)));
			apdu[0] = 0;
			apdu[1] = (octet)(cmd->cdf_len / 256);
			apdu[2] = (octet)cmd->cdf_len;
			memCopy(apdu + 3, cmd->cdf, cmd->cdf_len);
			apdu += 3 + cmd->cdf_len;
		}
		count += 3 + cmd->cdf_len;
	}
	// кодировать rdf_len: пустая форма
	if (cmd->rdf_len == 0)
		count += 0;
	// кодировать rdf_len: короткая форма
	else if (cmd->rdf_len <= 256 && cmd->cdf_len < 256)
	{
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 1, cmd, apduCmdSizeof(cmd)));
			apdu[0] = (octet)cmd->rdf_len;
		}
		count += 1;
	}
	// кодировать rdf_len: длинная форма, 2 октета
	else if (cmd->cdf_len)
	{ 
		ASSERT(256 <= cmd->cdf_len || 256 < cmd->rdf_len);
		ASSERT(cmd->rdf_len <= 65536);
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 2, cmd, apduCmdSizeof(cmd)));
			apdu[0] = (octet)(cmd->rdf_len / 256);
			apdu[1] = (octet)cmd->rdf_len;
		}
		count += 2;
	}
	else
	{
		ASSERT(256 < cmd->rdf_len && cmd->rdf_len <= 65536);
		if (apdu)
		{
			ASSERT(memIsDisjoint2(apdu, 3, cmd, apduCmdSizeof(cmd)));
			apdu[0] = 0;
			apdu[1] = (octet)(cmd->rdf_len / 256);
			apdu[2] = (octet)cmd->rdf_len;
		}
		count += 3;
	}
	// возвратить длину кода
	return count;
}